

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  UnifiedVectorFormat sdata;
  long *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  uVar4 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if (*local_68 != 0) {
        iVar6 = (idx_t)*(uint *)(*local_68 + iVar5 * 4);
      }
      lVar2 = **(long **)(local_60 + iVar6 * 8);
      if (lVar2 != 0) {
        lVar7 = lVar7 + *(long *)(lVar2 + 0x18);
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  duckdb::ListVector::Reserve(result,lVar7 + uVar4);
  lVar7 = duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    lVar2 = *(long *)(result + 0x20);
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if (*local_68 != 0) {
        iVar6 = (idx_t)*(uint *)(*local_68 + iVar5 * 4);
      }
      plVar3 = *(long **)(local_60 + iVar6 * 8);
      plVar1 = (long *)(lVar2 + iVar5 * 0x10);
      *(ulong *)(lVar2 + iVar5 * 0x10) = uVar4;
      lVar9 = *plVar3;
      if (lVar9 == 0) {
        lVar9 = 0;
      }
      else {
        for (puVar8 = *(undefined8 **)(lVar9 + 0x10); puVar8 != (undefined8 *)0x0;
            puVar8 = (undefined8 *)*puVar8) {
          *(undefined1 *)(*(long *)(lVar7 + 0x20) + uVar4) = *(undefined1 *)(puVar8 + 1);
          uVar4 = uVar4 + 1;
        }
        lVar9 = uVar4 - *plVar1;
      }
      plVar1[1] = lVar9;
      iVar5 = iVar5 + 1;
    } while (iVar5 != count);
  }
  duckdb::ListVector::SetListSize(result,uVar4);
  duckdb::Vector::Verify((ulong)result);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}